

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall astarTest_methodTesting_Test::TestBody(astarTest_methodTesting_Test *this)

{
  pointer *this_00;
  bool bVar1;
  pointer piVar2;
  char *pcVar3;
  undefined1 local_188 [8];
  astar a;
  astar a1;
  astar astar2;
  astar astar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_130;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_118;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_100;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_e8;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_d0;
  undefined1 auStack_b8 [8];
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> path1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  m1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> path2;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_3;
  undefined1 local_50 [8];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  m;
  bool status1;
  bool status;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  map local_1a;
  map local_19 [7];
  map map2;
  map map1;
  
  astar::astar((astar *)local_188);
  m1.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)m1.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)
             &path1.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,"a.x_start_","0",(int *)local_188,
             (int *)&m1.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if ((char)path1.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage == '\0') {
    testing::Message::Message
              ((Message *)
               &m1.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (m1.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      piVar2 = (pointer)0x13fbf3;
    }
    else {
      piVar2 = ((m1.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
               ,0x49,(char *)piVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_50,
               (Message *)
               &m1.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&m1);
    astar::astar((astar *)&a.x_goal_,0,0,5,5);
    m1.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(m1.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,5);
    this_00 = &path1.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)this_00,"a1.x_goal_","5",&a1.x_start_,
               (int *)&m1.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((char)path1.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != '\0') {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&m1);
      astar::astar((astar *)&a1.x_goal_,0,0,2,2);
      map::create_map((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       *)this_00,&local_1a);
      m1.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&astar1.x_goal_,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)this_00);
      astar::astar_path((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                        local_50,(astar *)&a1.x_goal_,
                        (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)&astar1.x_goal_);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_move_assign
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &m1.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 local_50);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 local_50);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&astar1.x_goal_);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_130,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&path1.
                   super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_118,
                 (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &m1.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = map::print_path(&local_1a,&local_130,
                              (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                              &local_118);
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                (&local_118);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_130);
      auStack_b8._0_4_ = 1;
      m.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = bVar1;
      testing::internal::CmpHelperEQ<bool,int>
                ((internal *)local_50,"status1","1",
                 (bool *)((long)&m.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 6),
                 (int *)auStack_b8);
      if (local_50[0] == (internal)0x0) {
        testing::Message::Message((Message *)auStack_b8);
        if (m.
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
          piVar2 = (pointer)0x13fbf3;
        }
        else {
          piVar2 = ((m.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                   _M_start;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                   ,0x54,(char *)piVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)local_68,(Message *)auStack_b8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_68);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)auStack_b8);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&m);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&m);
        astar::astar((astar *)&astar2.x_goal_,0,0,5,5);
        map::create_map((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)local_50,local_19);
        *(undefined4 *)(*(long *)(CONCAT71(local_50._1_7_,local_50[0]) + 0x78) + 0x14) = 0;
        auStack_b8 = (undefined1  [8])0x0;
        path1.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        path1.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::vector(&local_100,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)local_50);
        astar::astar_path((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                          local_68,(astar *)&astar2.x_goal_,&local_100);
        std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::_M_move_assign
                  ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)auStack_b8,
                   (_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   local_68);
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   local_68);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector(&local_100);
        local_28.ptr_._0_4_ = 0xffffffff;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_68,"path1[0].first","-1",(int *)auStack_b8,(int *)&local_28);
        if (local_68[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_28);
          if (gtest_ar_3._0_8_ == 0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = *(char **)gtest_ar_3._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&stack0xffffffffffffffd0,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                     ,0x5c,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&local_28);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_28);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_3);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::vector(&local_e8,
                   (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)local_50);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)&local_d0
                     ,(vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      auStack_b8);
          bVar1 = map::print_path(local_19,&local_e8,
                                  (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                   *)&local_d0);
          std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::
          ~_Vector_base(&local_d0);
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::~vector(&local_e8);
          local_28.ptr_._0_4_ = (uint)local_28.ptr_ & 0xffffff00;
          m.
          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = bVar1;
          testing::internal::CmpHelperEQ<bool,bool>
                    ((internal *)local_68,"status","false",
                     (bool *)((long)&m.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                     (bool *)&local_28);
          if (local_68[0] == (internal)0x0) {
            testing::Message::Message((Message *)&local_28);
            if (gtest_ar_3._0_8_ == 0) {
              pcVar3 = "";
            }
            else {
              pcVar3 = *(char **)gtest_ar_3._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&stack0xffffffffffffffd0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
                       ,0x5f,pcVar3);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&stack0xffffffffffffffd0,(Message *)&local_28);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffd0)
            ;
            testing::internal::
            scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~scoped_ptr(&local_28);
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar_3);
        std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                  ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                   auStack_b8);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   *)local_50);
      }
      std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
                ((_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 &m1.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&path1.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      return;
    }
    testing::Message::Message
              ((Message *)
               &m1.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (m1.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      piVar2 = (pointer)0x13fbf3;
    }
    else {
      piVar2 = ((m1.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
               _M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_50,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ysshah95[P]Astar-Algorithm-for-ACME-Robotics/test/test.cpp"
               ,0x4c,(char *)piVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)local_50,
               (Message *)
               &m1.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_50);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&m1.
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&m1);
  return;
}

Assistant:

TEST(astarTest, methodTesting) {
  astar a;

  ASSERT_EQ(a.x_start_, 0);

  astar a1(0, 0, 5, 5);
  ASSERT_EQ(a1.x_goal_, 5);

  astar astar2(0, 0, 2, 2);
  map map2;
  std::vector<std::vector<int>> m1 = map2.create_map();
  std::vector<std::pair<int, int>> path2;
  path2 = astar2.astar_path(m1);
  bool status1 = map2.print_path(m1, path2);
  ASSERT_EQ(status1, 1);

  astar astar1(0, 0, 5, 5);
  map map1;
  std::vector<std::vector<int>> m = map1.create_map();
  m[5][5] = 0;
  std::vector<std::pair<int, int>> path1;
  path1 = astar1.astar_path(m);
  ASSERT_EQ(path1[0].first, -1);

  bool status = map1.print_path(m, path1);
  ASSERT_EQ(status, false);
}